

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.h
# Opt level: O3

String * __thiscall
asl::Map<asl::String,_asl::String>::operator[](Map<asl::String,_asl::String> *this,String *key)

{
  uint k;
  String local_60;
  KeyVal local_48;
  
  k = indexOf(this,key);
  if ((int)k < 0) {
    local_60.field_2._space[0] = '\0';
    local_60._size = 0;
    local_60._len = 0;
    KeyVal::KeyVal(&local_48,key,&local_60);
    k = ~k;
    Array<asl::Map<asl::String,_asl::String>::KeyVal>::insert(&this->a,k,&local_48);
    if (local_48.value._size != 0) {
      free(local_48.value.field_2._str);
    }
    if (local_48.key._size != 0) {
      free(local_48.key.field_2._str);
    }
    if (local_60._size != 0) {
      free((void *)CONCAT71(local_60.field_2._1_7_,local_60.field_2._space[0]));
    }
  }
  return &(this->a)._a[k].value;
}

Assistant:

T& Map<K,T>::operator[](const K& key)
{
	int i = indexOf(key);
	if(i >= 0)
		return a[i].value;
	else
	{
		a.insert(-i-1, KeyVal(key, T()));
		return a[-i-1].value;
	}
}